

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_randomness(int N,void *pBuf)

{
  uchar uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  sqlite3_mutex *psVar5;
  sqlite3_vfs *psVar6;
  long lVar7;
  char k [256];
  
  iVar4 = sqlite3_initialize();
  if (iVar4 != 0) {
    return;
  }
  bVar2 = true;
  if ((sqlite3Config.bCoreMutex == 0) ||
     (psVar5 = (*sqlite3Config.mutex.xMutexAlloc)(5), psVar5 == (sqlite3_mutex *)0x0)) {
    psVar5 = (sqlite3_mutex *)0x0;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(psVar5);
    bVar2 = false;
  }
  if (N < 1 || pBuf == (void *)0x0) {
    sqlite3Prng.isInit = '\0';
    if (!bVar2) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar5);
      return;
    }
  }
  else {
    if (sqlite3Prng.isInit == '\0') {
      sqlite3Prng.i = '\0';
      sqlite3Prng.j = '\0';
      psVar6 = sqlite3_vfs_find((char *)0x0);
      (*psVar6->xRandomness)(psVar6,0x100,k);
      for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
        sqlite3Prng.s[lVar7] = (uchar)lVar7;
      }
      bVar3 = sqlite3Prng.j;
      for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
        bVar3 = bVar3 + k[lVar7] + sqlite3Prng.s[lVar7];
        uVar1 = sqlite3Prng.s[bVar3];
        sqlite3Prng.s[bVar3] = sqlite3Prng.s[lVar7];
        sqlite3Prng.s[lVar7] = uVar1;
      }
      sqlite3Prng.isInit = '\x01';
    }
    else {
      bVar3 = sqlite3Prng.j;
    }
    lVar7 = 0;
    do {
      sqlite3Prng.i = sqlite3Prng.i + 1;
      uVar1 = sqlite3Prng.s[sqlite3Prng.i];
      bVar3 = bVar3 + uVar1;
      sqlite3Prng.s[sqlite3Prng.i] = sqlite3Prng.s[bVar3];
      sqlite3Prng.s[bVar3] = uVar1;
      *(uchar *)((long)pBuf + lVar7) = sqlite3Prng.s[(byte)(uVar1 + sqlite3Prng.s[sqlite3Prng.i])];
      lVar7 = lVar7 + 1;
    } while (N != (int)lVar7);
    sqlite3Prng.j = bVar3;
    if (!bVar2) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar5);
    }
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_randomness(int N, void *pBuf){
  unsigned char t;
  unsigned char *zBuf = pBuf;

  /* The "wsdPrng" macro will resolve to the pseudo-random number generator
  ** state vector.  If writable static data is unsupported on the target,
  ** we have to locate the state vector at run-time.  In the more common
  ** case where writable static data is supported, wsdPrng can refer directly
  ** to the "sqlite3Prng" state vector declared above.
  */
#ifdef SQLITE_OMIT_WSD
  struct sqlite3PrngType *p = &GLOBAL(struct sqlite3PrngType, sqlite3Prng);
# define wsdPrng p[0]
#else
# define wsdPrng sqlite3Prng
#endif

#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif

#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return;
#endif

#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_PRNG);
#endif

  sqlite3_mutex_enter(mutex);
  if( N<=0 || pBuf==0 ){
    wsdPrng.isInit = 0;
    sqlite3_mutex_leave(mutex);
    return;
  }

  /* Initialize the state of the random number generator once,
  ** the first time this routine is called.  The seed value does
  ** not need to contain a lot of randomness since we are not
  ** trying to do secure encryption or anything like that...
  **
  ** Nothing in this file or anywhere else in SQLite does any kind of
  ** encryption.  The RC4 algorithm is being used as a PRNG (pseudo-random
  ** number generator) not as an encryption device.
  */
  if( !wsdPrng.isInit ){
    int i;
    char k[256];
    wsdPrng.j = 0;
    wsdPrng.i = 0;
    sqlite3OsRandomness(sqlite3_vfs_find(0), 256, k);
    for(i=0; i<256; i++){
      wsdPrng.s[i] = (u8)i;
    }
    for(i=0; i<256; i++){
      wsdPrng.j += wsdPrng.s[i] + k[i];
      t = wsdPrng.s[wsdPrng.j];
      wsdPrng.s[wsdPrng.j] = wsdPrng.s[i];
      wsdPrng.s[i] = t;
    }
    wsdPrng.isInit = 1;
  }

  assert( N>0 );
  do{
    wsdPrng.i++;
    t = wsdPrng.s[wsdPrng.i];
    wsdPrng.j += t;
    wsdPrng.s[wsdPrng.i] = wsdPrng.s[wsdPrng.j];
    wsdPrng.s[wsdPrng.j] = t;
    t += wsdPrng.s[wsdPrng.i];
    *(zBuf++) = wsdPrng.s[t];
  }while( --N );
  sqlite3_mutex_leave(mutex);
}